

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_options.hpp
# Opt level: O2

string_type * __thiscall
jsoncons::basic_json_options_common<char>::neginf_to_str_abi_cxx11_
          (string_type *__return_storage_ptr__,basic_json_options_common<char> *this)

{
  string_type *s;
  
  if ((*(ushort *)&this->field_0x8 & 0x30) == 0x10) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->neginf_to_str_);
  }
  return __return_storage_ptr__;
}

Assistant:

string_type neginf_to_str() const
    {
        if (enable_neginf_to_str_)
        {
            return neginf_to_str_;
        }
        else if (enable_inf_to_str_)
        {
            string_type s;
            s.push_back('-');
            s.append(inf_to_str_);
            return s;
        }
        else
        {
            return neginf_to_str_; // empty string
        }
    }